

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acb.h
# Opt level: O2

void Acb_ObjRemoveFaninFanoutOne(Acb_Ntk_t *p,int iObj,int iFanin)

{
  int iVar1;
  Vec_Int_t *p_00;
  int *piVar2;
  
  p_00 = Vec_WecEntry(&p->vFanouts,iFanin);
  iVar1 = Vec_IntRemove(p_00,iObj);
  if (iVar1 == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                  ,0x21a,"void Acb_ObjRemoveFaninFanoutOne(Acb_Ntk_t *, int, int)");
  }
  piVar2 = Acb_ObjFanins(p,iObj);
  iVar1 = Acb_ObjWhatFanin(p,iObj,iFanin);
  if (piVar2[(long)iVar1 + 1] == iFanin) {
    Acb_ObjDeleteFaninIndex(p,iObj,iVar1);
    return;
  }
  __assert_fail("pFanins[ 1 + iFaninIndex ] == iFanin",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                ,0x1b3,"void Acb_ObjDeleteFanin(Acb_Ntk_t *, int, int)");
}

Assistant:

static inline void Acb_ObjRemoveFaninFanoutOne( Acb_Ntk_t * p, int iObj, int iFanin )
{
    int RetValue = Vec_IntRemove( Vec_WecEntry(&p->vFanouts, iFanin), iObj );
    assert( RetValue );
    Acb_ObjDeleteFanin( p, iObj, iFanin );
}